

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::QueueFrame(Segment *this,Frame *frame)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  undefined8 in_RSI;
  long in_RDI;
  int32_t i;
  Frame **frames;
  int32_t new_capacity;
  int32_t new_size;
  int local_3c;
  int local_2c;
  
  if (*(int *)(in_RDI + 0x138) < *(int *)(in_RDI + 0x13c) + 1) {
    if (*(int *)(in_RDI + 0x138) == 0) {
      local_3c = 2;
    }
    else {
      local_3c = *(int *)(in_RDI + 0x138) << 1;
    }
    if (local_3c < 1) {
      return false;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_3c;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (pvVar4 == (void *)0x0) {
      return false;
    }
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x13c); local_2c = local_2c + 1) {
      *(undefined8 *)((long)pvVar4 + (long)local_2c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x130) + (long)local_2c * 8);
    }
    if (*(void **)(in_RDI + 0x130) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x130));
    }
    *(void **)(in_RDI + 0x130) = pvVar4;
    *(int *)(in_RDI + 0x138) = local_3c;
  }
  iVar1 = *(int *)(in_RDI + 0x13c);
  *(int *)(in_RDI + 0x13c) = iVar1 + 1;
  *(undefined8 *)(*(long *)(in_RDI + 0x130) + (long)iVar1 * 8) = in_RSI;
  return true;
}

Assistant:

bool Segment::QueueFrame(Frame* frame) {
  const int32_t new_size = frames_size_ + 1;

  if (new_size > frames_capacity_) {
    // Add more frames.
    const int32_t new_capacity = (!frames_capacity_) ? 2 : frames_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    Frame** const frames = new (std::nothrow) Frame*[new_capacity];  // NOLINT
    if (!frames)
      return false;

    for (int32_t i = 0; i < frames_size_; ++i) {
      frames[i] = frames_[i];
    }

    delete[] frames_;
    frames_ = frames;
    frames_capacity_ = new_capacity;
  }

  frames_[frames_size_++] = frame;

  return true;
}